

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cftmdl1(int n,double *a,double *w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long in_RDX;
  double *in_RSI;
  int in_EDI;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int j0;
  int j;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wk3i;
  double wk3r;
  double wk1i;
  double wk1r;
  double wn4r;
  int mh;
  int m;
  int k;
  int j3;
  int j2;
  int j1;
  
  iVar18 = in_EDI >> 3;
  iVar19 = iVar18 * 2;
  iVar20 = iVar18 * 4;
  iVar21 = iVar18 * 6;
  dVar1 = *in_RSI;
  dVar26 = in_RSI[iVar20];
  dVar27 = in_RSI[1];
  dVar2 = in_RSI[iVar20 + 1];
  dVar3 = *in_RSI;
  dVar24 = in_RSI[iVar20];
  dVar25 = in_RSI[1];
  dVar4 = in_RSI[iVar20 + 1];
  dVar5 = in_RSI[iVar19];
  dVar6 = in_RSI[iVar21];
  dVar7 = in_RSI[iVar19 + 1];
  dVar8 = in_RSI[iVar21 + 1];
  dVar9 = in_RSI[iVar19];
  dVar10 = in_RSI[iVar21];
  dVar11 = in_RSI[iVar19 + 1];
  dVar12 = in_RSI[iVar21 + 1];
  *in_RSI = dVar1 + dVar26 + dVar5 + dVar6;
  in_RSI[1] = dVar27 + dVar2 + dVar7 + dVar8;
  in_RSI[iVar19] = (dVar1 + dVar26) - (dVar5 + dVar6);
  in_RSI[iVar19 + 1] = (dVar27 + dVar2) - (dVar7 + dVar8);
  in_RSI[iVar20] = (dVar3 - dVar24) - (dVar11 - dVar12);
  in_RSI[iVar20 + 1] = (dVar25 - dVar4) + (dVar9 - dVar10);
  in_RSI[iVar21] = (dVar3 - dVar24) + (dVar11 - dVar12);
  in_RSI[iVar21 + 1] = (dVar25 - dVar4) - (dVar9 - dVar10);
  dVar1 = *(double *)(in_RDX + 8);
  wk1i._0_4_ = 0;
  for (wn4r._4_4_ = 2; wn4r._4_4_ < iVar18; wn4r._4_4_ = wn4r._4_4_ + 2) {
    dVar26 = *(double *)(in_RDX + (long)(wk1i._0_4_ + 4) * 8);
    dVar27 = *(double *)(in_RDX + (long)(wk1i._0_4_ + 5) * 8);
    dVar2 = *(double *)(in_RDX + (long)(wk1i._0_4_ + 6) * 8);
    dVar3 = *(double *)(in_RDX + (long)(wk1i._0_4_ + 7) * 8);
    iVar20 = wn4r._4_4_ + iVar19;
    iVar21 = iVar20 + iVar19;
    iVar22 = iVar21 + iVar19;
    dVar24 = in_RSI[wn4r._4_4_];
    dVar25 = in_RSI[iVar21];
    dVar4 = in_RSI[wn4r._4_4_ + 1];
    dVar5 = in_RSI[iVar21 + 1];
    dVar6 = in_RSI[wn4r._4_4_];
    dVar7 = in_RSI[iVar21];
    dVar8 = in_RSI[wn4r._4_4_ + 1];
    dVar9 = in_RSI[iVar21 + 1];
    dVar10 = in_RSI[iVar20];
    dVar11 = in_RSI[iVar22];
    dVar12 = in_RSI[iVar20 + 1];
    dVar13 = in_RSI[iVar22 + 1];
    dVar14 = in_RSI[iVar20];
    dVar15 = in_RSI[iVar22];
    dVar16 = in_RSI[iVar20 + 1];
    dVar17 = in_RSI[iVar22 + 1];
    in_RSI[wn4r._4_4_] = dVar24 + dVar25 + dVar10 + dVar11;
    in_RSI[wn4r._4_4_ + 1] = dVar4 + dVar5 + dVar12 + dVar13;
    in_RSI[iVar20] = (dVar24 + dVar25) - (dVar10 + dVar11);
    in_RSI[iVar20 + 1] = (dVar4 + dVar5) - (dVar12 + dVar13);
    dVar24 = (dVar6 - dVar7) - (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) + (dVar14 - dVar15);
    in_RSI[iVar21] = dVar26 * dVar24 + -(dVar27 * dVar25);
    in_RSI[iVar21 + 1] = dVar26 * dVar25 + dVar27 * dVar24;
    dVar24 = (dVar6 - dVar7) + (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) - (dVar14 - dVar15);
    in_RSI[iVar22] = dVar2 * dVar24 + dVar3 * dVar25;
    in_RSI[iVar22 + 1] = dVar2 * dVar25 + -(dVar3 * dVar24);
    iVar20 = iVar19 - wn4r._4_4_;
    iVar21 = iVar20 + iVar19;
    iVar22 = iVar21 + iVar19;
    iVar23 = iVar22 + iVar19;
    dVar24 = in_RSI[iVar20];
    dVar25 = in_RSI[iVar22];
    dVar4 = in_RSI[iVar20 + 1];
    dVar5 = in_RSI[iVar22 + 1];
    dVar6 = in_RSI[iVar20];
    dVar7 = in_RSI[iVar22];
    dVar8 = in_RSI[iVar20 + 1];
    dVar9 = in_RSI[iVar22 + 1];
    dVar10 = in_RSI[iVar21];
    dVar11 = in_RSI[iVar23];
    dVar12 = in_RSI[iVar21 + 1];
    dVar13 = in_RSI[iVar23 + 1];
    dVar14 = in_RSI[iVar21];
    dVar15 = in_RSI[iVar23];
    dVar16 = in_RSI[iVar21 + 1];
    dVar17 = in_RSI[iVar23 + 1];
    in_RSI[iVar20] = dVar24 + dVar25 + dVar10 + dVar11;
    in_RSI[iVar20 + 1] = dVar4 + dVar5 + dVar12 + dVar13;
    in_RSI[iVar21] = (dVar24 + dVar25) - (dVar10 + dVar11);
    in_RSI[iVar21 + 1] = (dVar4 + dVar5) - (dVar12 + dVar13);
    dVar24 = (dVar6 - dVar7) - (dVar16 - dVar17);
    dVar25 = (dVar8 - dVar9) + (dVar14 - dVar15);
    in_RSI[iVar22] = dVar27 * dVar24 + -(dVar26 * dVar25);
    in_RSI[iVar22 + 1] = dVar27 * dVar25 + dVar26 * dVar24;
    dVar26 = (dVar6 - dVar7) + (dVar16 - dVar17);
    dVar27 = (dVar8 - dVar9) - (dVar14 - dVar15);
    in_RSI[iVar23] = dVar3 * dVar26 + dVar2 * dVar27;
    in_RSI[iVar23 + 1] = dVar3 * dVar27 + -(dVar2 * dVar26);
    wk1i._0_4_ = wk1i._0_4_ + 4;
  }
  iVar20 = iVar18 * 3;
  iVar21 = iVar18 * 5;
  iVar19 = iVar18 * 7;
  dVar26 = in_RSI[iVar18];
  dVar27 = in_RSI[iVar21];
  dVar2 = in_RSI[iVar18 + 1];
  dVar3 = in_RSI[iVar21 + 1];
  dVar24 = in_RSI[iVar18];
  dVar25 = in_RSI[iVar21];
  dVar4 = in_RSI[iVar18 + 1];
  dVar5 = in_RSI[iVar21 + 1];
  dVar6 = in_RSI[iVar20];
  dVar7 = in_RSI[iVar19];
  dVar8 = in_RSI[iVar20 + 1];
  dVar9 = in_RSI[iVar19 + 1];
  dVar10 = in_RSI[iVar20];
  dVar11 = in_RSI[iVar19];
  dVar12 = in_RSI[iVar20 + 1];
  dVar13 = in_RSI[iVar19 + 1];
  in_RSI[iVar18] = dVar26 + dVar27 + dVar6 + dVar7;
  in_RSI[iVar18 + 1] = dVar2 + dVar3 + dVar8 + dVar9;
  in_RSI[iVar20] = (dVar26 + dVar27) - (dVar6 + dVar7);
  in_RSI[iVar20 + 1] = (dVar2 + dVar3) - (dVar8 + dVar9);
  dVar26 = (dVar24 - dVar25) - (dVar12 - dVar13);
  dVar27 = (dVar4 - dVar5) + (dVar10 - dVar11);
  in_RSI[iVar21] = dVar1 * (dVar26 - dVar27);
  in_RSI[iVar21 + 1] = dVar1 * (dVar27 + dVar26);
  dVar26 = (dVar24 - dVar25) + (dVar12 - dVar13);
  dVar27 = (dVar4 - dVar5) - (dVar10 - dVar11);
  in_RSI[iVar19] = -dVar1 * (dVar26 + dVar27);
  in_RSI[iVar19 + 1] = -dVar1 * (dVar27 - dVar26);
  return;
}

Assistant:

void cftmdl1(int n, double *a, double *w) {
  int j, j0, j1, j2, j3, k, m, mh;
  double wn4r, wk1r, wk1i, wk3r, wk3i;
  double x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  mh = n >> 3;
  m = 2 * mh;
  j1 = m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[0] + a[j2];
  x0i = a[1] + a[j2 + 1];
  x1r = a[0] - a[j2];
  x1i = a[1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[0] = x0r + x2r;
  a[1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  a[j2] = x1r - x3i;
  a[j2 + 1] = x1i + x3r;
  a[j3] = x1r + x3i;
  a[j3 + 1] = x1i - x3r;
  wn4r = w[1];
  k = 0;
  for (j = 2; j < mh; j += 2) {
    k += 4;
    wk1r = w[k];
    wk1i = w[k + 1];
    wk3r = w[k + 2];
    wk3i = w[k + 3];
    j1 = j + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j] + a[j2];
    x0i = a[j + 1] + a[j2 + 1];
    x1r = a[j] - a[j2];
    x1i = a[j + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1r * x0r - wk1i * x0i;
    a[j2 + 1] = wk1r * x0i + wk1i * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3r * x0r + wk3i * x0i;
    a[j3 + 1] = wk3r * x0i - wk3i * x0r;
    j0 = m - j;
    j1 = j0 + m;
    j2 = j1 + m;
    j3 = j2 + m;
    x0r = a[j0] + a[j2];
    x0i = a[j0 + 1] + a[j2 + 1];
    x1r = a[j0] - a[j2];
    x1i = a[j0 + 1] - a[j2 + 1];
    x2r = a[j1] + a[j3];
    x2i = a[j1 + 1] + a[j3 + 1];
    x3r = a[j1] - a[j3];
    x3i = a[j1 + 1] - a[j3 + 1];
    a[j0] = x0r + x2r;
    a[j0 + 1] = x0i + x2i;
    a[j1] = x0r - x2r;
    a[j1 + 1] = x0i - x2i;
    x0r = x1r - x3i;
    x0i = x1i + x3r;
    a[j2] = wk1i * x0r - wk1r * x0i;
    a[j2 + 1] = wk1i * x0i + wk1r * x0r;
    x0r = x1r + x3i;
    x0i = x1i - x3r;
    a[j3] = wk3i * x0r + wk3r * x0i;
    a[j3 + 1] = wk3i * x0i - wk3r * x0r;
  }
  j0 = mh;
  j1 = j0 + m;
  j2 = j1 + m;
  j3 = j2 + m;
  x0r = a[j0] + a[j2];
  x0i = a[j0 + 1] + a[j2 + 1];
  x1r = a[j0] - a[j2];
  x1i = a[j0 + 1] - a[j2 + 1];
  x2r = a[j1] + a[j3];
  x2i = a[j1 + 1] + a[j3 + 1];
  x3r = a[j1] - a[j3];
  x3i = a[j1 + 1] - a[j3 + 1];
  a[j0] = x0r + x2r;
  a[j0 + 1] = x0i + x2i;
  a[j1] = x0r - x2r;
  a[j1 + 1] = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  a[j2] = wn4r * (x0r - x0i);
  a[j2 + 1] = wn4r * (x0i + x0r);
  x0r = x1r + x3i;
  x0i = x1i - x3r;
  a[j3] = -wn4r * (x0r + x0i);
  a[j3 + 1] = -wn4r * (x0i - x0r);
}